

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Instr * __thiscall GlobOpt::FindUpperBoundsCheckInstr(GlobOpt *this,Instr *fromInstr)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  puVar3 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
  do {
    fromInstr = fromInstr->m_prev;
    if (fromInstr == (Instr *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4330,"(upperBoundCheck)","upperBoundCheck");
      if (!bVar2) goto LAB_0046bb68;
      *puVar3 = 0;
    }
    if ((fromInstr->m_kind == InstrKindProfiledLabel) || (fromInstr->m_kind == InstrKindLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      *puVar3 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                         ,0x4331,"(!upperBoundCheck->IsLabelInstr())",
                         "!upperBoundCheck->IsLabelInstr()");
      if (!bVar2) {
LAB_0046bb68:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar3 = 0;
    }
    if (fromInstr->m_opcode == BoundCheck) {
      return fromInstr;
    }
  } while( true );
}

Assistant:

IR::Instr*
GlobOpt::FindUpperBoundsCheckInstr(IR::Instr* fromInstr)
{
    IR::Instr *upperBoundCheck = fromInstr;
    do
    {
        upperBoundCheck = upperBoundCheck->m_prev;
        Assert(upperBoundCheck);
        Assert(!upperBoundCheck->IsLabelInstr());
    } while (upperBoundCheck->m_opcode != Js::OpCode::BoundCheck);
    return upperBoundCheck;
}